

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O1

void borg_init_flow_kill(void)

{
  monster_race *pmVar1;
  char **ppcVar2;
  _Bool _Var3;
  int iVar4;
  char *pcVar5;
  uint *puVar6;
  long lVar7;
  wchar_t wVar8;
  long lVar9;
  ushort uVar10;
  wchar_t wVar11;
  ulong uVar12;
  int16_t what [1024];
  char *text [1024];
  short local_2838 [1024];
  undefined8 local_2038 [1025];
  
  borg_kills_cnt = 0;
  borg_kills_nxt = 1;
  borg_kills = (borg_kill *)mem_zalloc(0x1d800);
  borg_race_count = (int16_t *)mem_zalloc((ulong)((uint)z_info->r_max * 2));
  borg_race_death = (int16_t *)mem_zalloc((ulong)((uint)z_info->r_max * 2));
  uVar10 = z_info->r_max;
  if (2 < uVar10) {
    lVar9 = 1;
    lVar7 = 0x160;
    do {
      pmVar1 = r_info;
      if (((*(long *)((long)r_info + lVar7 + -0x80) != 0) &&
          (_Var3 = flag_has_dbg((bitflag *)(lVar7 + -0x34 + (long)r_info),0xb,1,"r_ptr->flags",
                                "RF_UNIQUE"), !_Var3)) && (pmVar1->flags[lVar7 + -0x5c] == '\0')) {
        borg_race_death[lVar9] = 1;
      }
      lVar9 = lVar9 + 1;
      uVar10 = z_info->r_max;
      lVar7 = lVar7 + 0xd0;
    } while (lVar9 < (long)((ulong)uVar10 - 1));
  }
  uVar10 = uVar10 - 1;
  wVar8 = L'\0';
  if (1 < uVar10) {
    wVar8 = L'\0';
    uVar12 = 1;
    lVar7 = 300;
    do {
      pmVar1 = r_info;
      if ((*(long *)((long)r_info + lVar7 + -0x4c) != 0) &&
         (_Var3 = flag_has_dbg(r_info->flags + lVar7 + -0x5c,0xb,1,"r_ptr->flags","RF_UNIQUE"),
         _Var3)) {
        pcVar5 = borg_massage_special_chars(*(char **)((long)pmVar1 + lVar7 + -0x4c));
        local_2038[wVar8] = pcVar5;
        local_2838[wVar8] = (short)uVar12;
        pcVar5 = *(char **)((long)pmVar1 + lVar7 + -0x4c);
        iVar4 = strcmp(pcVar5,"Morgoth, Lord of Darkness");
        if (iVar4 == 0) {
          borg_morgoth_id = *(uint *)((long)pmVar1 + lVar7 + -0x54);
        }
        iVar4 = strcmp(pcVar5,"Sauron, the Sorcerer");
        if (iVar4 == 0) {
          borg_sauron_id = *(uint *)((long)pmVar1 + lVar7 + -0x54);
        }
        iVar4 = strcmp(pcVar5,"The Tarrasque");
        if (iVar4 == 0) {
          borg_tarrasque_id = *(uint *)((long)pmVar1 + lVar7 + -0x54);
        }
        wVar8 = wVar8 + L'\x01';
      }
      uVar12 = uVar12 + 1;
      lVar7 = lVar7 + 0xd0;
    } while (uVar10 != uVar12);
  }
  borg_sort_comp = borg_sort_comp_hook;
  borg_sort_swap = borg_sort_swap_hook;
  borg_sort(local_2038,local_2838,wVar8);
  borg_unique_size = wVar8;
  borg_unique_text = (char **)mem_zalloc((long)wVar8 * 8);
  puVar6 = (uint *)mem_zalloc((long)borg_unique_size << 2);
  ppcVar2 = borg_unique_text;
  borg_unique_what = puVar6;
  if (L'\0' < wVar8) {
    uVar12 = 0;
    do {
      ppcVar2[uVar12] = (char *)local_2038[uVar12];
      uVar12 = uVar12 + 1;
    } while ((uint)wVar8 != uVar12);
    if (L'\0' < wVar8) {
      uVar12 = 0;
      do {
        puVar6[uVar12] = (int)local_2838[uVar12];
        uVar12 = uVar12 + 1;
      } while ((uint)wVar8 != uVar12);
    }
  }
  wVar8 = L'\0';
  if (1 < uVar10) {
    wVar8 = L'\0';
    uVar12 = 1;
    lVar7 = 300;
    do {
      pmVar1 = r_info;
      wVar11 = wVar8;
      if ((*(long *)((long)r_info + lVar7 + -0x4c) != 0) &&
         (_Var3 = flag_has_dbg(r_info->flags + lVar7 + -0x5c,0xb,1,"r_ptr->flags","RF_UNIQUE"),
         !_Var3)) {
        pcVar5 = borg_massage_special_chars(*(char **)((long)pmVar1 + lVar7 + -0x4c));
        local_2038[wVar8] = pcVar5;
        local_2838[wVar8] = (short)uVar12;
        wVar11 = wVar8 + L'\x01';
        pcVar5 = *(char **)((long)pmVar1 + lVar7 + -0x3c);
        if (pcVar5 != (char *)0x0) {
          pcVar5 = borg_massage_special_chars(pcVar5);
          local_2038[wVar11] = pcVar5;
          local_2838[wVar11] = (short)uVar12;
          wVar11 = wVar8 + L'\x02';
        }
      }
      wVar8 = wVar11;
      uVar12 = uVar12 + 1;
      lVar7 = lVar7 + 0xd0;
    } while (uVar10 != uVar12);
  }
  borg_sort_comp = borg_sort_comp_hook;
  borg_sort_swap = borg_sort_swap_hook;
  borg_sort(local_2038,local_2838,wVar8);
  borg_normal_size = wVar8;
  borg_normal_text = (char **)mem_zalloc((long)wVar8 * 8);
  puVar6 = (uint *)mem_zalloc((long)borg_normal_size << 2);
  ppcVar2 = borg_normal_text;
  borg_normal_what = puVar6;
  if (L'\0' < wVar8) {
    uVar12 = 0;
    do {
      ppcVar2[uVar12] = (char *)local_2038[uVar12];
      uVar12 = uVar12 + 1;
    } while ((uint)wVar8 != uVar12);
    if (L'\0' < wVar8) {
      uVar12 = 0;
      do {
        puVar6[uVar12] = (int)local_2838[uVar12];
        uVar12 = uVar12 + 1;
      } while ((uint)wVar8 != uVar12);
    }
  }
  return;
}

Assistant:

void borg_init_flow_kill(void)
{
    /*** Monster tracking ***/

    /* No monsters yet */
    borg_kills_cnt = 0;
    borg_kills_nxt = 1;

    /* Array of monsters */
    borg_kills = mem_zalloc(256 * sizeof(borg_kill));

    /* Count racial appearances */
    borg_race_count = mem_zalloc(z_info->r_max * sizeof(int16_t));

    /* Count racial deaths */
    borg_race_death = mem_zalloc(z_info->r_max * sizeof(int16_t));

    /*** XXX XXX XXX Hack -- Cheat ***/

    /* Hack -- Extract dead uniques */
    for (int i = 1; i < z_info->r_max - 1; i++) {
        struct monster_race *r_ptr = &r_info[i];

        /* Skip non-monsters */
        if (!r_ptr->name)
            continue;

        /* Skip non-uniques */
        if (rf_has(r_ptr->flags, RF_UNIQUE))
            continue;

        /* Mega-Hack -- Access "dead unique" list */
        if (r_ptr->max_num == 0)
            borg_race_death[i] = 1;
    }

    borg_init_monster_names();
}